

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Operation *operations,
          bool useBranch)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  ostringstream stream;
  undefined1 auStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_198,"Test ",5);
  if (((byte)*this & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_198,"atomicCounter()",0xf)
    ;
  }
  if (((byte)*this & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_198,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_198," atomicCounterIncrement()",0x19);
  }
  if (((byte)*this & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_198,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_198," atomicCounterDecrement()",0x19);
  }
  pcVar2 = ".";
  bVar3 = (char)operations != '\0';
  if (bVar3) {
    pcVar2 = " calls with branches.";
  }
  lVar1 = 1;
  if (bVar3) {
    lVar1 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_198,pcVar2,lVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_198);
  std::ios_base::~ios_base((ios_base *)(auStack_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string operationToDescription (const AtomicCounterTest::Operation& operations, bool useBranch)
{
	std::ostringstream	stream;
	bool				firstOperation = 0;

	stream
	<< "Test ";

	if ((operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "atomicCounter()";
		firstOperation = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterIncrement()";
		firstOperation = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterDecrement()";
		firstOperation = false;
	}


	if (useBranch)
		stream << " calls with branches.";
	else
		stream << ".";

	return stream.str();
}